

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

void __thiscall glslang::TProgram::~TProgram(TProgram *this)

{
  TInfoSink *this_00;
  TIntermediate *this_01;
  TPoolAllocator *this_02;
  long lVar1;
  
  this->_vptr_TProgram = (_func_int **)&PTR__TProgram_0089a2b0;
  this_00 = this->infoSink;
  if (this_00 != (TInfoSink *)0x0) {
    TInfoSink::~TInfoSink(this_00);
  }
  operator_delete(this_00,0x60);
  if (this->reflection != (TReflection *)0x0) {
    (*this->reflection->_vptr_TReflection[1])();
  }
  for (lVar1 = -0xe; lVar1 != 0; lVar1 = lVar1 + 1) {
    if (this->newedIntermediate[lVar1 + 0xe] == true) {
      this_01 = *(TIntermediate **)(this->newedIntermediate + lVar1 * 8);
      if (this_01 != (TIntermediate *)0x0) {
        TIntermediate::~TIntermediate(this_01);
      }
      operator_delete(this_01,0x7e8);
    }
  }
  this_02 = this->pool;
  if (this_02 != (TPoolAllocator *)0x0) {
    TPoolAllocator::~TPoolAllocator(this_02);
  }
  operator_delete(this_02,0x60);
  lVar1 = 0x148;
  do {
    std::__cxx11::_List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>::_M_clear
              ((_List_base<glslang::TShader_*,_std::allocator<glslang::TShader_*>_> *)
               ((long)this->stages + lVar1 + -0x10));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -8);
  return;
}

Assistant:

TProgram::~TProgram()
{
    delete infoSink;
    delete reflection;

    for (int s = 0; s < EShLangCount; ++s)
        if (newedIntermediate[s])
            delete intermediate[s];

    delete pool;
}